

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O0

void process_monsters(wchar_t minimum_energy)

{
  byte bVar1;
  ushort uVar2;
  _Bool _Var3;
  wchar_t wVar4;
  monster_conflict *mon_00;
  int iVar5;
  wchar_t slow_level;
  _Bool moving;
  monster_conflict *mon;
  wchar_t wStack_10;
  _Bool regen;
  wchar_t mspeed;
  wchar_t i;
  wchar_t minimum_energy_local;
  
  iVar5 = turn % 100;
  wStack_10 = cave_monster_max(cave);
  while (((wStack_10 = wStack_10 + L'\xffffffff', L'\0' < wStack_10 && ((player->is_dead & 1U) == 0)
          ) && ((player->upkeep->generate_level & 1U) == 0))) {
    mon_00 = cave_monster(cave,wStack_10);
    if (((mon_00->race != (monster_race *)0x0) &&
        (_Var3 = flag_has_dbg(mon_00->mflag,2,9,"mon->mflag","MFLAG_HANDLED"), !_Var3)) &&
       (minimum_energy <= (int)(uint)mon_00->energy)) {
      bVar1 = mon_00->energy;
      uVar2 = z_info->move_energy;
      flag_on_dbg(mon_00->mflag,2,9,"mon->mflag","MFLAG_HANDLED");
      if (iVar5 == 0) {
        regen_monster(mon_00,L'\x01');
      }
      mon._4_4_ = (wchar_t)mon_00->mspeed;
      if (mon_00->m_timed[5] != 0) {
        mon._4_4_ = mon._4_4_ + L'\n';
      }
      if (mon_00->m_timed[4] != 0) {
        wVar4 = monster_effect_level((monster *)mon_00,L'\x04');
        mon._4_4_ = mon._4_4_ + wVar4 * -2;
      }
      wVar4 = turn_energy(mon._4_4_);
      mon_00->energy = mon_00->energy + (char)wVar4;
      if (uVar2 <= bVar1) {
        mon_00->energy = mon_00->energy - (char)z_info->move_energy;
        _Var3 = monster_is_mimicking((monster *)mon_00);
        if (((!_Var3) && (_Var3 = monster_check_active(mon_00), _Var3)) &&
           (_Var3 = process_monster_timed(mon_00), !_Var3)) {
          cave->mon_current = wStack_10;
          monster_turn(mon_00);
          monster_take_terrain_damage((monster *)mon_00);
          cave->mon_current = L'\xffffffff';
        }
      }
    }
  }
  player->upkeep->update = player->upkeep->update | 0x80;
  return;
}

Assistant:

void process_monsters(int minimum_energy)
{
	int i;
	int mspeed;

	/* Only process some things every so often */
	bool regen = false;

	/* Regenerate hitpoints and mana every 100 game turns */
	if (turn % 100 == 0)
		regen = true;

	/* Process the monsters (backwards) */
	for (i = cave_monster_max(cave) - 1; i >= 1; i--) {
		struct monster *mon;
		bool moving;

		/* Handle "leaving" */
		if (player->is_dead || player->upkeep->generate_level) break;

		/* Get a 'live' monster */
		mon = cave_monster(cave, i);
		if (!mon->race) continue;

		/* Ignore monsters that have already been handled */
		if (mflag_has(mon->mflag, MFLAG_HANDLED))
			continue;

		/* Not enough energy to move yet */
		if (mon->energy < minimum_energy) continue;

		/* Does this monster have enough energy to move? */
		moving = mon->energy >= z_info->move_energy ? true : false;

		/* Prevent reprocessing */
		mflag_on(mon->mflag, MFLAG_HANDLED);

		/* Handle monster regeneration if requested */
		if (regen)
			regen_monster(mon, 1);

		/* Calculate the net speed */
		mspeed = mon->mspeed;
		if (mon->m_timed[MON_TMD_FAST])
			mspeed += 10;
		if (mon->m_timed[MON_TMD_SLOW]) {
			int slow_level = monster_effect_level(mon, MON_TMD_SLOW);
			mspeed -= (2 * slow_level);
		}

		/* Give this monster some energy */
		mon->energy += turn_energy(mspeed);

		/* End the turn of monsters without enough energy to move */
		if (!moving)
			continue;

		/* Use up "some" energy */
		mon->energy -= z_info->move_energy;

		/* Mimics lie in wait */
		if (monster_is_mimicking(mon)) continue;

		/* Check if the monster is active */
		if (monster_check_active(mon)) {
			/* Process timed effects - skip turn if necessary */
			if (process_monster_timed(mon))
				continue;

			/* Set this monster to be the current actor */
			cave->mon_current = i;

			/* The monster takes its turn */
			monster_turn(mon);

			/*
			 * For symmetry with the player, monster can take
			 * terrain damage after its turn.
			 */
			monster_take_terrain_damage(mon);

			/* Monster is no longer current */
			cave->mon_current = -1;
		}
	}

	/* Update monster visibility after this */
	/* XXX This may not be necessary */
	player->upkeep->update |= PU_MONSTERS;
}